

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-visuals.c
# Opt level: O0

void visuals_flicker_set_color
               (visuals_flicker *table,size_t cycle_index,size_t color_index,uint8_t attr)

{
  uint8_t attr_local;
  size_t color_index_local;
  size_t cycle_index_local;
  visuals_flicker *table_local;
  
  if (((table != (visuals_flicker *)0x0) && (cycle_index < table->max_cycles)) &&
     (color_index < table->colors_per_cycle)) {
    table->cycles[cycle_index * table->colors_per_cycle + color_index] = attr;
  }
  return;
}

Assistant:

static void visuals_flicker_set_color(struct visuals_flicker *table,
		size_t const cycle_index,
		size_t const color_index,
		uint8_t const attr)
{
	if (table == NULL) {
		return;
	}

	if (cycle_index >= table->max_cycles) {
		return;
	}

	if (color_index >= table->colors_per_cycle) {
		return;
	}

	table->cycles[(cycle_index * table->colors_per_cycle) + color_index] = attr;
}